

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::CharSet<unsigned_int>::GetNextRange
          (CharSet<unsigned_int> *this,Char searchCharStart,Char *outLowerChar,Char *outHigherChar)

{
  Char CVar1;
  code *pcVar2;
  Char CVar3;
  Char CVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  undefined4 *puVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  CharSet<char16_t> *pCVar13;
  long lVar14;
  Char local_34;
  Char local_32 [3];
  char16 currentLowChar;
  char16 currentHighChar;
  
  if (outLowerChar == (Char *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x675,"(outLowerChar != nullptr)","outLowerChar != nullptr");
    if (!bVar5) goto LAB_00e71cb0;
    *puVar8 = 0;
  }
  if (outHigherChar == (Char *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x676,"(outHigherChar != nullptr)","outHigherChar != nullptr");
    if (!bVar5) goto LAB_00e71cb0;
    *puVar8 = 0;
  }
  if (searchCharStart < 0x110000) {
    local_34 = L'\x01';
    local_32[0] = L'\0';
    uVar11 = (ulong)(searchCharStart >> 0x10);
    bVar6 = CharSet<char16_t>::GetNextRange
                      (this->characterPlanes + uVar11,(Char)searchCharStart,&local_34,local_32);
    bVar5 = true;
    if (!bVar6) {
      pCVar13 = this->characterPlanes + uVar11;
      do {
        uVar10 = uVar11;
        pCVar13 = pCVar13 + 1;
        bVar5 = uVar10 < 0x10;
        if (uVar10 == 0x10) {
          uVar11 = 0x11;
          goto LAB_00e7196c;
        }
        bVar5 = CharSet<char16_t>::GetNextRange(pCVar13,L'\0',&local_34,local_32);
        uVar11 = uVar10 + 1;
      } while (!bVar5);
      bVar5 = uVar10 < 0x10;
    }
LAB_00e7196c:
    CVar4 = local_32[0];
    CVar3 = local_34;
    iVar9 = (int)uVar11;
    bVar6 = iVar9 != 0x11;
    if (!bVar6) {
      return bVar6;
    }
    if ((ushort)local_32[0] < (ushort)local_34) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                         ,0x68d,"(currentHighChar >= currentLowChar)",
                         "currentHighChar >= currentLowChar");
      if (!bVar7) goto LAB_00e71cb0;
      *puVar8 = 0;
    }
    if (!bVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                         ,0x27d,"(index < NumberOfPlanes)","index < NumberOfPlanes");
      if (!bVar7) goto LAB_00e71cb0;
      *puVar8 = 0;
    }
    uVar12 = iVar9 * 0x10000;
    *outLowerChar = (ushort)CVar3 | uVar12;
    if (!bVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                         ,0x27d,"(index < NumberOfPlanes)","index < NumberOfPlanes");
      if (!bVar5) {
LAB_00e71cb0:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar8 = 0;
    }
    *outHigherChar = (ushort)CVar4 | uVar12;
    if (iVar9 + 1 < 0x11) {
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      lVar14 = (long)(iVar9 + 1);
      pCVar13 = this->characterPlanes + (uVar11 & 0xffffffff);
      do {
        uVar12 = uVar12 + 0x10000;
        pCVar13 = pCVar13 + 1;
        bVar5 = CharSet<char16_t>::GetNextRange(pCVar13,L'\0',&local_34,local_32);
        CVar3 = local_34;
        if (!bVar5) {
          return bVar6;
        }
        CVar1 = *outHigherChar;
        if (lVar14 < 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                             ,0x27c,"(index >= 0)","index >= 0");
          if (!bVar5) goto LAB_00e71cb0;
          *puVar8 = 0;
        }
        CVar4 = local_32[0];
        if ((ushort)CVar3 + uVar12 != CVar1 + 1) {
          return bVar6;
        }
        if (lVar14 < 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                             ,0x27c,"(index >= 0)","index >= 0");
          if (!bVar5) goto LAB_00e71cb0;
          *puVar8 = 0;
        }
        if ((ushort)CVar4 + uVar12 <= *outHigherChar) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                             ,0x69a,"(this->AddOffset(currentHighChar, index) > *outHigherChar)",
                             "this->AddOffset(currentHighChar, index) > *outHigherChar");
          if (!bVar5) goto LAB_00e71cb0;
          *puVar8 = 0;
        }
        if (lVar14 < 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                             ,0x27c,"(index >= 0)","index >= 0");
          if (!bVar5) goto LAB_00e71cb0;
          *puVar8 = 0;
        }
        *outHigherChar = (ushort)CVar4 + uVar12;
        lVar14 = lVar14 + 1;
      } while ((int)lVar14 != 0x11);
    }
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool CharSet<codepoint_t>::GetNextRange(Char searchCharStart, _Out_ Char *outLowerChar, _Out_ Char *outHigherChar)
    {
        Assert(outLowerChar != nullptr);
        Assert(outHigherChar != nullptr);
        if (searchCharStart >= 0x110000)
        {
            return false;
        }

        char16 currentLowChar = 1, currentHighChar = 0;
        int index = this->CharToIndex(searchCharStart);
        char16 offsetLessSearchCharStart = this->RemoveOffset(searchCharStart);

        for (; index < NumberOfPlanes; index++)
        {
            if (this->characterPlanes[index].GetNextRange(offsetLessSearchCharStart, &currentLowChar, &currentHighChar))
            {
                break;
            }
            offsetLessSearchCharStart = 0x0;
        }

        if (index == NumberOfPlanes)
        {
            return false;
        }
        Assert(currentHighChar >= currentLowChar);
        // else found range
        *outLowerChar = this->AddOffset(currentLowChar, index);
        *outHigherChar = this->AddOffset(currentHighChar, index);

        // Check if range crosses plane boundaries
        index ++;
        for (; index < NumberOfPlanes; index++)
        {
            if (!this->characterPlanes[index].GetNextRange(0x0, &currentLowChar, &currentHighChar) || *outHigherChar + 1 != this->AddOffset(currentLowChar, index))
            {
                break;
            }
            Assert(this->AddOffset(currentHighChar, index) > *outHigherChar);
            *outHigherChar = this->AddOffset(currentHighChar, index);
        }

        return true;
    }